

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_decode_unknown(pt_packet_decoder *decoder,pt_packet *packet)

{
  int size;
  pt_packet *packet_local;
  pt_packet_decoder *decoder_local;
  
  if (decoder == (pt_packet_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    decoder_local._4_4_ = pt_pkt_read_unknown(packet,decoder->pos,&decoder->config);
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_pkt_decode_unknown(struct pt_packet_decoder *decoder,
				 struct pt_packet *packet)
{
	int size;

	if (!decoder)
		return -pte_internal;

	size = pt_pkt_read_unknown(packet, decoder->pos, &decoder->config);
	if (size < 0)
		return size;

	return size;
}